

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

void stl_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
         int *nsjump,int *ntjump,int *nljump,int *ni,int *no,double *rw,double *season,double *trend
         ,double *work)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int local_48;
  uint local_44;
  int newnp;
  int newnl;
  int newns;
  int newnt;
  int userw;
  
  uVar1 = *n;
  newnt = uVar1 + *np * 2;
  uVar5 = ~newnt;
  newns = 0;
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    trend[uVar6] = 0.0;
  }
  uVar1 = imax(3,*ns);
  newnp = uVar1;
  uVar2 = imax(3,*nt);
  newnl = uVar2;
  local_44 = imax(3,*nl);
  if ((uVar1 & 1) == 0) {
    newnp = uVar1 | 1;
  }
  if ((uVar2 & 1) == 0) {
    newnl = uVar2 | 1;
  }
  if ((local_44 & 1) == 0) {
    local_44 = local_44 | 1;
  }
  local_48 = imax(2,*np);
  lVar3 = (long)newnt;
  newnt = 0;
  while( true ) {
    stlstp_(y,n,&local_48,&newnp,&newnl,(int *)&local_44,isdeg,itdeg,ildeg,nsjump,ntjump,nljump,ni,
            &newns,rw,season,trend,work);
    if (*no <= newnt) break;
    newnt = newnt + 1;
    uVar4 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar4 = 0;
    }
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      work[(long)(int)uVar5 + lVar3 + uVar6 + 1] = trend[uVar6] + season[uVar6];
    }
    stlrwt_(y,n,work,rw);
    newns = 1;
  }
  if (*no < 1) {
    uVar6 = 0;
    uVar4 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      rw[uVar6] = 1.0;
    }
  }
  return;
}

Assistant:

void stl_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int *
	ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *no, double *rw, double *season, double *trend, 
	double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1;

    /* Local variables */
    int i__, k, newnl, newnp, newns, newnt;
	int userw;

/* Arg */
/* 	n                   : length(y) */
/* 	ns, nt, nl          : spans        for `s', `t' and `l' smoother */
/* 	isdeg, itdeg, ildeg : local degree for `s', `t' and `l' smoother */
/* 	nsjump,ntjump,nljump: ........     for `s', `t' and `l' smoother */
/*       ni, no              : number of inner and outer (robust) iterations */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    userw = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L1: */
    }
/* the three spans must be at least three and odd: */
    newns = imax(3,*ns);
    newnt = imax(3,*nt);
    newnl = imax(3,*nl);
    if (newns % 2 == 0) {
	++newns;
    }
    if (newnt % 2 == 0) {
	++newnt;
    }
    if (newnl % 2 == 0) {
	++newnl;
    }
/* periodicity at least 2: */
    newnp = imax(2,*np);
    k = 0;
/* --- outer loop -- robustnes iterations */
L100:
    stlstp_(&y[1], n, &newnp, &newns, &newnt, &newnl, isdeg, itdeg, ildeg, 
	    nsjump, ntjump, nljump, ni, &userw, &rw[1], &season[1], &trend[1],
	     &work[work_offset]);
    ++k;
    if (k > *no) {
	goto L10;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	work[i__ + work_dim1] = trend[i__] + season[i__];
/* L3: */
    }
    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
    userw = 1;
    goto L100;
/* --- end Loop */
L10:
/*     robustness weights when there were no robustness iterations: */
    if (*no <= 0) {
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L15: */
	}
    }
}